

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall ImDrawList::AddDrawCmd(ImDrawList *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ImDrawCmd local_38;
  
  local_38.UserCallbackData = (void *)0x0;
  local_38.ElemCount = 0;
  local_38._36_4_ = 0;
  local_38.UserCallback = (ImDrawCallback)0x0;
  local_38.ClipRect.x = (this->_CmdHeader).ClipRect.x;
  local_38.ClipRect.y = (this->_CmdHeader).ClipRect.y;
  local_38.ClipRect.z = (this->_CmdHeader).ClipRect.z;
  local_38.ClipRect.w = (this->_CmdHeader).ClipRect.w;
  local_38.TextureId = (this->_CmdHeader).TextureId;
  local_38.VtxOffset = (this->_CmdHeader).VtxOffset;
  local_38.IdxOffset = (this->IdxBuffer).Size;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_38.ClipRect._0_8_;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_38.ClipRect._8_8_;
  auVar2 = vcmpps_avx(auVar2,auVar3,2);
  auVar1 = vshufps_avx(auVar2,auVar2,0x50);
  auVar2 = vpcmpeqd_avx(auVar3,auVar3);
  if (((auVar2 & ~auVar1) >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
      -1 < SUB161(auVar2 & ~auVar1,0xf)) {
    ImVector<ImDrawCmd>::push_back(&this->CmdBuffer,&local_38);
    return;
  }
  __assert_fail("draw_cmd.ClipRect.x <= draw_cmd.ClipRect.z && draw_cmd.ClipRect.y <= draw_cmd.ClipRect.w"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_draw.cpp"
                ,0x1c1,"void ImDrawList::AddDrawCmd()");
}

Assistant:

void ImDrawList::AddDrawCmd()
{
    ImDrawCmd draw_cmd;
    draw_cmd.ClipRect = _CmdHeader.ClipRect;    // Same as calling ImDrawCmd_HeaderCopy()
    draw_cmd.TextureId = _CmdHeader.TextureId;
    draw_cmd.VtxOffset = _CmdHeader.VtxOffset;
    draw_cmd.IdxOffset = IdxBuffer.Size;

    IM_ASSERT(draw_cmd.ClipRect.x <= draw_cmd.ClipRect.z && draw_cmd.ClipRect.y <= draw_cmd.ClipRect.w);
    CmdBuffer.push_back(draw_cmd);
}